

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall rw::World::removeClump(World *this,Clump *clump)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  Atomic *atomic;
  Light *light;
  Camera *cam;
  LLLink *local_48;
  LLLink *lnk_2;
  LLLink *_next_2;
  LLLink *lnk_1;
  LLLink *_next_1;
  LLLink *lnk;
  LLLink *_next;
  Clump *clump_local;
  World *this_local;
  
  LLLink::remove(&clump->inWorld,(char *)clump);
  _next_1 = (clump->atomics).link.next;
  while( true ) {
    pLVar1 = _next_1->next;
    pLVar2 = LinkList::end(&clump->atomics);
    if (_next_1 == pLVar2) break;
    atomic = Atomic::fromClump(_next_1);
    removeAtomic(this,atomic);
    _next_1 = pLVar1;
  }
  _next_2 = (clump->lights).link.next;
  while( true ) {
    pLVar1 = _next_2->next;
    pLVar2 = LinkList::end(&clump->lights);
    if (_next_2 == pLVar2) break;
    light = Light::fromClump(_next_2);
    removeLight(this,light);
    _next_2 = pLVar1;
  }
  local_48 = (clump->cameras).link.next;
  while( true ) {
    pLVar1 = local_48->next;
    pLVar2 = LinkList::end(&clump->cameras);
    if (local_48 == pLVar2) break;
    cam = Camera::fromClump(local_48);
    removeCamera(this,cam);
    local_48 = pLVar1;
  }
  clump->world = (World *)0x0;
  return;
}

Assistant:

void
World::removeClump(Clump *clump)
{
	assert(clump->world == this);
	clump->inWorld.remove();
	FORLIST(lnk, clump->atomics)
		this->removeAtomic(Atomic::fromClump(lnk));
	FORLIST(lnk, clump->lights)
		this->removeLight(Light::fromClump(lnk));
	FORLIST(lnk, clump->cameras)
		this->removeCamera(Camera::fromClump(lnk));
	clump->world = nil;
}